

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O0

void __thiscall sptk::reaper::FdFilter::MirrorFilter(FdFilter *this,float *fc,bool invert)

{
  undefined1 auVar1 [16];
  float fVar2;
  ulong uVar3;
  void *pvVar4;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  int ncoefb2;
  int i;
  float integral;
  float sum;
  float *dp3;
  float *dp2;
  float *dp1;
  int local_3c;
  float local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)(in_RDI + 0x18);
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *(void **)(in_RDI + 0x10) = pvVar4;
  local_3c = *(int *)(in_RDI + 0x18) / 2;
  local_30 = (float *)(in_RSI + (long)(local_3c + 1) * 4);
  local_28 = *(float **)(in_RDI + 0x10);
  local_20 = (float *)(*(long *)(in_RDI + 0x10) + (long)*(int *)(in_RDI + 0x18) * 4);
  local_38 = 0.0;
  while (local_20 = local_20 + -1, local_30 = local_30 + -1, 0 < local_3c) {
    if ((in_DL & 1) == 0) {
      fVar2 = *local_30;
      *local_28 = fVar2;
      *local_20 = fVar2;
    }
    else {
      local_38 = *local_30 + local_38;
      fVar2 = -*local_30;
      *local_28 = fVar2;
      *local_20 = fVar2;
    }
    local_28 = local_28 + 1;
    local_3c = local_3c + -1;
  }
  if ((in_DL & 1) == 0) {
    *local_20 = *local_30;
  }
  else {
    *local_20 = (*local_30 + local_38 * 2.0) - *local_30;
  }
  return;
}

Assistant:

void FdFilter::MirrorFilter(float *fc, bool invert) {
  float *dp1, *dp2, *dp3, sum, integral;
  int i, ncoefb2;

  filter_coeffs_ = new float[n_filter_coeffs_];
  ncoefb2 = 1 + n_filter_coeffs_ / 2;
  // Copy the half-filter and its mirror image into the coefficient array.
  for (i = ncoefb2 - 1, dp3 = fc+ncoefb2 - 1, dp2 = filter_coeffs_,
       dp1 = filter_coeffs_ + n_filter_coeffs_ - 1, integral = 0.0; i-- > 0;) {
    if (!invert) {
      *dp1-- = *dp2++ = *dp3--;
    } else {
      integral += (sum = *dp3--);
      *dp1-- = *dp2++ = -sum;
    }
  }
  if (!invert) {
    *dp1 = *dp3; /* point of symmetry */
  } else {
    integral *= 2;
    integral += *dp3;
    *dp1 = integral - *dp3;
  }
}